

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::Printer::ValidateIndexLookupInBounds
          (Printer *this,size_t index,size_t current_arg_index,size_t args_len,PrintOptions opts)

{
  PrintOptions opts_00;
  PrintOptions opts_01;
  bool bVar1;
  anon_class_24_3_3e137c64 local_c0;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_a8;
  undefined8 local_91;
  bool local_89;
  undefined8 local_88;
  undefined1 local_80;
  anon_class_16_2_f7f469bf local_78;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_68;
  undefined8 local_51;
  bool local_49;
  size_t local_48;
  size_t args_len_local;
  size_t current_arg_index_local;
  size_t index_local;
  Printer *this_local;
  undefined1 local_1a;
  undefined8 local_12;
  PrintOptions opts_local;
  
  local_49 = opts.use_annotation_frames;
  local_51 = opts._0_8_;
  local_78.this = this;
  local_78.index = index;
  local_48 = args_len;
  args_len_local = current_arg_index;
  current_arg_index_local = index;
  index_local = (size_t)this;
  unique0x100000f8 = local_51;
  local_1a = local_49;
  local_12 = local_51;
  opts_local.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
  _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>._0_1_ =
       local_49;
  absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
  FunctionRef<google::protobuf::io::Printer::ValidateIndexLookupInBounds(unsigned_long,unsigned_long,unsigned_long,google::protobuf::io::Printer::PrintOptions)::__0,void>
            ((FunctionRef<std::__cxx11::string()> *)&local_68,&local_78);
  local_88 = local_51;
  local_80 = local_49;
  opts_01.use_annotation_frames = local_49;
  opts_01.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
  _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
       (undefined2)local_51;
  opts_01.checks_are_debug_only = (bool)local_51._2_1_;
  opts_01.use_substitution_map = (bool)local_51._3_1_;
  opts_01.use_curly_brace_substitutions = (bool)local_51._4_1_;
  opts_01.allow_digit_substitutions = (bool)local_51._5_1_;
  opts_01.strip_spaces_around_vars = (bool)local_51._6_1_;
  opts_01.strip_raw_string_indentation = (bool)local_51._7_1_;
  bVar1 = Validate(index < args_len,opts_01,local_68);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar1 = current_arg_index_local <= args_len_local;
    local_91 = local_12;
    local_89 = (bool)opts_local.loc.
                     super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>.
                     _0_1_;
    local_c0.index = current_arg_index_local;
    local_c0.current_arg_index = args_len_local;
    local_c0.this = this;
    absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
    FunctionRef<google::protobuf::io::Printer::ValidateIndexLookupInBounds(unsigned_long,unsigned_long,unsigned_long,google::protobuf::io::Printer::PrintOptions)::__1,void>
              ((FunctionRef<std::__cxx11::string()> *)&local_a8,&local_c0);
    opts_00.use_annotation_frames = local_89;
    opts_00.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
    _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
         (undefined2)local_91;
    opts_00.checks_are_debug_only = (bool)local_91._2_1_;
    opts_00.use_substitution_map = (bool)local_91._3_1_;
    opts_00.use_curly_brace_substitutions = (bool)local_91._4_1_;
    opts_00.allow_digit_substitutions = (bool)local_91._5_1_;
    opts_00.strip_spaces_around_vars = (bool)local_91._6_1_;
    opts_00.strip_raw_string_indentation = (bool)local_91._7_1_;
    bVar1 = Validate(bVar1,opts_00,local_a8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      opts_local.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
      ._M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>.
      _M_engaged = true;
    }
    else {
      opts_local.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>
      ._M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>.
      _M_engaged = false;
    }
  }
  else {
    opts_local.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
    _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>.
    _M_engaged = false;
  }
  return opts_local.loc.
         super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>._M_payload.
         super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>._M_engaged;
}

Assistant:

bool Printer::ValidateIndexLookupInBounds(size_t index,
                                          size_t current_arg_index,
                                          size_t args_len, PrintOptions opts) {
  if (!Validate(index < args_len, opts, [this, index] {
        return absl::StrFormat("annotation %c{%d%c is out of bounds",
                               options_.variable_delimiter, index + 1,
                               options_.variable_delimiter);
      })) {
    return false;
  }
  if (!Validate(
          index <= current_arg_index, opts, [this, index, current_arg_index] {
            return absl::StrFormat(
                "annotation arg must be in correct order as given; expected "
                "%c{%d%c but got %c{%d%c",
                options_.variable_delimiter, current_arg_index + 1,
                options_.variable_delimiter, options_.variable_delimiter,
                index + 1, options_.variable_delimiter);
          })) {
    return false;
  }
  return true;
}